

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cbtBoxShape.cpp
# Opt level: O2

void __thiscall cbtBoxShape::cbtBoxShape(cbtBoxShape *this,cbtVector3 *boxHalfExtents)

{
  float fVar1;
  undefined1 auVar3 [56];
  undefined1 auVar2 [64];
  undefined1 auVar4 [16];
  cbtVector3 cVar5;
  
  cbtPolyhedralConvexShape::cbtPolyhedralConvexShape(&this->super_cbtPolyhedralConvexShape);
  (this->super_cbtPolyhedralConvexShape).super_cbtConvexInternalShape.super_cbtConvexShape.
  super_cbtCollisionShape._vptr_cbtCollisionShape =
       (_func_int **)&PTR__cbtPolyhedralConvexShape_011952f0;
  (this->super_cbtPolyhedralConvexShape).super_cbtConvexInternalShape.super_cbtConvexShape.
  super_cbtCollisionShape.m_shapeType = 0;
  fVar1 = (this->super_cbtPolyhedralConvexShape).super_cbtConvexInternalShape.m_collisionMargin;
  auVar3 = (undefined1  [56])0x0;
  cVar5 = ::operator*(boxHalfExtents,
                      (cbtVector3 *)
                      &(this->super_cbtPolyhedralConvexShape).super_cbtConvexInternalShape.
                       super_cbtConvexShape.super_cbtCollisionShape.field_0x1c);
  auVar2._0_8_ = cVar5.m_floats._0_8_;
  auVar2._8_56_ = auVar3;
  auVar4._4_4_ = fVar1;
  auVar4._0_4_ = fVar1;
  auVar4._8_4_ = fVar1;
  auVar4._12_4_ = fVar1;
  auVar4 = vsubps_avx(auVar2._0_16_,auVar4);
  auVar4 = vinsertps_avx(auVar4,ZEXT416((uint)(cVar5.m_floats[2] - fVar1)),0x28);
  *(undefined1 (*) [16])
   (this->super_cbtPolyhedralConvexShape).super_cbtConvexInternalShape.m_implicitShapeDimensions.
   m_floats = auVar4;
  cbtConvexInternalShape::setSafeMargin((cbtConvexInternalShape *)this,boxHalfExtents,0.1);
  return;
}

Assistant:

cbtBoxShape::cbtBoxShape(const cbtVector3& boxHalfExtents)
	: cbtPolyhedralConvexShape()
{
	m_shapeType = BOX_SHAPE_PROXYTYPE;

	cbtVector3 margin(getMargin(), getMargin(), getMargin());
	m_implicitShapeDimensions = (boxHalfExtents * m_localScaling) - margin;

	setSafeMargin(boxHalfExtents);
}